

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void test_handshake_api(void)

{
  undefined1 *puVar1;
  ptls_context_t *ppVar2;
  ptls_context_t *ppVar3;
  int iVar4;
  ptls_t *ppVar5;
  ptls_t *ppVar6;
  size_t max_early_data_size;
  size_t coffs [5];
  size_t soffs [5];
  size_t inlen;
  ptls_save_ticket_t save_ticket;
  ptls_encrypt_ticket_t encrypt_ticket;
  ptls_update_traffic_key_t update_traffic_key;
  traffic_secrets_t server_secrets;
  traffic_secrets_t client_secrets;
  ptls_buffer_t local_688;
  ptls_t *local_668;
  size_t local_660;
  ptls_buffer_t local_658;
  size_t local_638 [6];
  size_t local_608 [6];
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  size_t local_5b8;
  ptls_save_ticket_t local_5b0;
  ptls_encrypt_ticket_t local_5a8;
  ptls_update_traffic_key_t local_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  ptls_iovec_t local_588;
  anon_union_104_2_21cbdc79_for_st_ptls_handshake_properties_t_0 local_578;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  ptls_iovec_t local_4e8;
  anon_union_104_2_21cbdc79_for_st_ptls_handshake_properties_t_0 local_4d8;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  ptls_iovec_t local_448;
  undefined1 local_438 [64];
  undefined1 local_3f8 [64];
  undefined1 auStack_3b8 [64];
  undefined1 auStack_378 [192];
  undefined1 auStack_2b8 [64];
  undefined1 auStack_278 [64];
  undefined1 local_238 [128];
  undefined1 auStack_1b8 [64];
  undefined1 auStack_178 [128];
  undefined1 local_f8 [64];
  undefined1 auStack_b8 [64];
  undefined1 auStack_78 [72];
  
  memset(local_238,0,0x200);
  memset(local_438,0,0x200);
  ppVar3 = ctx;
  local_638[4] = 0;
  local_638[2] = 0;
  local_638[3] = 0;
  local_638[0] = 0;
  local_638[1] = 0;
  local_5a0.cb = on_update_traffic_key;
  local_5a8.cb = on_copy_ticket;
  local_5b0.cb = on_save_ticket;
  ctx->update_traffic_key = &local_5a0;
  ppVar3->field_0x70 = ppVar3->field_0x70 | 0x10;
  ppVar3->save_ticket = &local_5b0;
  ppVar2 = ctx_peer;
  ctx_peer->update_traffic_key = &local_5a0;
  ppVar2->field_0x70 = ppVar2->field_0x70 | 0x10;
  ppVar2->encrypt_ticket = &local_5a8;
  ppVar2->ticket_lifetime = 0x15180;
  ppVar2->max_early_data_size = 0x2000;
  saved_ticket = (ptls_iovec_t)ZEXT816(0);
  local_658.base = "";
  local_658.capacity = 0;
  local_658.off = 0;
  local_658._24_8_ = (ulong)(uint)local_658._28_4_ << 0x20;
  local_688.base = "";
  local_688.capacity = 0;
  local_688.off = 0;
  local_688.is_allocated = 0;
  ppVar5 = ptls_client_new(ppVar3);
  ppVar5->data_ptr = local_238;
  ppVar6 = new_instance(ctx_peer,1);
  ppVar6->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
  (ppVar6->field_18).server.early_data_skipped_bytes = 0xffffffff;
  ppVar6->data_ptr = local_438;
  iVar4 = ptls_handle_message(ppVar5,&local_658,local_638,0,(void *)0x0,0,
                              (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar4 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4b7)
  ;
  local_668 = ppVar6;
  iVar4 = feed_messages(ppVar6,&local_688,local_608,local_658.base,local_638,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4b9)
  ;
  _ok((uint)(local_688.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4ba)
  ;
  _ok((uint)(ppVar6->state < PTLS_STATE_CLIENT_POST_HANDSHAKE),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4bb)
  ;
  iVar4 = bcmp(auStack_2b8,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4bc)
  ;
  local_5d0 = auStack_278;
  iVar4 = bcmp(local_5d0,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4bd)
  ;
  local_5d8 = auStack_3b8;
  iVar4 = bcmp(local_5d8,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4be)
  ;
  iVar4 = bcmp(auStack_378,"",0x40);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4bf)
  ;
  iVar4 = feed_messages(ppVar5,&local_658,local_638,local_688.base,local_608,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4c1)
  ;
  _ok((uint)(local_658.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4c2)
  ;
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar5->state),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4c3)
  ;
  iVar4 = bcmp(auStack_1b8,auStack_2b8,0x40);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4c4)
  ;
  iVar4 = bcmp(auStack_b8,local_5d8,0x40);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4c5)
  ;
  local_5c0 = auStack_178;
  iVar4 = bcmp(local_5c0,local_5d0,0x40);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4c6)
  ;
  local_5c8 = auStack_78;
  iVar4 = bcmp(auStack_78,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4c7)
  ;
  ppVar6 = local_668;
  iVar4 = feed_messages(local_668,&local_688,local_608,local_658.base,local_638,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4c9)
  ;
  _ok((uint)(local_688.off == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4ca)
  ;
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar6->state),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4cb)
  ;
  iVar4 = bcmp(auStack_78,auStack_378,0x40);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4cc)
  ;
  ptls_free(ppVar5);
  ptls_free(ppVar6);
  local_658.off = 0;
  local_688.off = 0;
  memset(local_238,0,0x200);
  memset(local_438,0,0x200);
  ppVar2 = ctx;
  local_638[0] = 0;
  local_638[1] = 0;
  local_638[2] = 0;
  local_638[3] = 0;
  local_638[4] = 0;
  local_608[0] = 0;
  local_608[1] = 0;
  local_608[2] = 0;
  local_608[3] = 0;
  local_608[4] = 0;
  ctx->save_ticket = (ptls_save_ticket_t *)0x0;
  local_578.client.max_early_data_size = &local_660;
  local_660 = 0;
  local_578._40_8_ = 0;
  local_508 = 0;
  uStack_500 = 0;
  local_578._96_8_ = 0;
  uStack_510 = 0;
  local_578.server.cookie.additional_data.base = (uint8_t *)0x0;
  local_578.server.cookie.additional_data.len = 0;
  local_578.server.selected_psk_binder.len = 0;
  local_578.server.cookie.key = (void *)0x0;
  local_578.client.esni_keys.base = (uint8_t *)0x0;
  local_578.client.esni_keys.len = 0;
  local_578.client.negotiated_protocols.list = (ptls_iovec_t *)0x0;
  local_578.client.negotiated_protocols.count = 0;
  local_578.client.session_ticket = saved_ticket;
  ppVar5 = ptls_client_new(ppVar2);
  ppVar5->data_ptr = local_238;
  ppVar6 = new_instance(ctx_peer,1);
  ppVar6->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
  (ppVar6->field_18).server.early_data_skipped_bytes = 0xffffffff;
  ppVar6->data_ptr = local_438;
  iVar4 = ptls_handle_message(ppVar5,&local_658,local_638,0,(void *)0x0,0,
                              (ptls_handshake_properties_t *)&local_578.client);
  _ok((uint)(iVar4 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4e2)
  ;
  _ok((uint)(local_660 != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4e3)
  ;
  iVar4 = bcmp(local_f8,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4e4)
  ;
  local_668 = ppVar6;
  iVar4 = feed_messages(ppVar6,&local_688,local_608,local_658.base,local_638,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4e6)
  ;
  _ok((uint)(local_688.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4e7)
  ;
  _ok((uint)(ppVar6->state < PTLS_STATE_CLIENT_POST_HANDSHAKE),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4e8)
  ;
  iVar4 = bcmp(local_f8,local_3f8,0x40);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4e9)
  ;
  iVar4 = bcmp(local_5d8,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4ea)
  ;
  iVar4 = bcmp(auStack_2b8,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4eb)
  ;
  puVar1 = local_5d0;
  iVar4 = bcmp(local_5d0,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4ec)
  ;
  iVar4 = bcmp(auStack_378,"",0x40);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4ed)
  ;
  iVar4 = feed_messages(ppVar5,&local_658,local_638,local_688.base,local_608,
                        (ptls_handshake_properties_t *)&local_578.client);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4ef)
  ;
  _ok((uint)(local_658.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4f0)
  ;
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar5->state),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4f1)
  ;
  iVar4 = bcmp(local_5c0,puVar1,0x40);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4f2)
  ;
  iVar4 = bcmp(local_5c8,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4f3)
  ;
  ppVar6 = local_668;
  iVar4 = feed_messages(local_668,&local_688,local_608,local_658.base,local_638,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4f5)
  ;
  _ok((uint)(local_688.off == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4f6)
  ;
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar6->state),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4f7)
  ;
  iVar4 = bcmp(auStack_378,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x4f8)
  ;
  ptls_free(ppVar5);
  ptls_free(ppVar6);
  local_658.off = 0;
  local_688.off = 0;
  memset(local_238,0,0x200);
  memset(local_438,0,0x200);
  local_638[0] = 0;
  local_638[1] = 0;
  local_638[2] = 0;
  local_638[3] = 0;
  local_638[4] = 0;
  local_608[0] = 0;
  local_608[1] = 0;
  local_608[2] = 0;
  local_608[3] = 0;
  local_608[4] = 0;
  ctx_peer->max_early_data_size = 0;
  local_458 = 0;
  uStack_450 = 0;
  local_578._40_8_ = 0;
  local_578.client.esni_keys.base = (uint8_t *)0x0;
  local_578.client.esni_keys.len = 0;
  local_578.server.selected_psk_binder.len = 0;
  local_578.server.cookie.key = (void *)0x0;
  local_578.server.cookie.additional_data.base = (uint8_t *)0x0;
  local_578.server.cookie.additional_data.len = 0;
  local_578._96_8_ = 0;
  uStack_510 = 0;
  local_508 = 0;
  uStack_500 = 0;
  local_448 = saved_ticket;
  local_578.client.negotiated_protocols.list = (ptls_iovec_t *)0x0;
  local_578.client.negotiated_protocols.count = 0;
  local_578.client.session_ticket = saved_ticket;
  local_578.client.max_early_data_size = &local_660;
  ppVar6 = ptls_client_new(ctx);
  ppVar6->data_ptr = local_238;
  ppVar5 = new_instance(ctx_peer,1);
  ppVar5->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
  (ppVar5->field_18).server.early_data_skipped_bytes = 0xffffffff;
  ppVar5->data_ptr = local_438;
  iVar4 = ptls_handle_message(ppVar6,&local_658,local_638,0,(void *)0x0,0,
                              (ptls_handshake_properties_t *)&local_578.client);
  _ok((uint)(iVar4 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x50c)
  ;
  _ok((uint)(local_660 != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x50d)
  ;
  iVar4 = bcmp(local_f8,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x50e)
  ;
  iVar4 = feed_messages(ppVar5,&local_688,local_608,local_658.base,local_638,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x510)
  ;
  _ok((uint)(local_688.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x511)
  ;
  _ok((uint)(ppVar5->state < PTLS_STATE_CLIENT_POST_HANDSHAKE),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x512)
  ;
  iVar4 = feed_messages(ppVar6,&local_658,local_638,local_688.base,local_608,
                        (ptls_handshake_properties_t *)&local_578.client);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x514)
  ;
  _ok((uint)(local_658.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x515)
  ;
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar6->state),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x516)
  ;
  _ok((uint)(local_578.client.early_data_acceptance == PTLS_EARLY_DATA_REJECTED),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x517)
  ;
  iVar4 = bcmp(local_3f8,"",0x40);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x518)
  ;
  iVar4 = feed_messages(ppVar5,&local_688,local_608,local_658.base,local_638,
                        (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x51a)
  ;
  _ok((uint)(local_688.off == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x51b)
  ;
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar5->state),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c");
  ptls_free(ppVar6);
  ptls_free(ppVar5);
  local_658.off = 0;
  local_688.off = 0;
  memset(local_238,0,0x200);
  memset(local_438,0,0x200);
  local_638[0] = 0;
  local_638[1] = 0;
  local_638[2] = 0;
  local_638[3] = 0;
  local_638[4] = 0;
  local_608[0] = 0;
  local_608[1] = 0;
  local_608[2] = 0;
  local_608[3] = 0;
  local_608[4] = 0;
  ctx_peer->max_early_data_size = 0x2000;
  uStack_470 = 0;
  local_468 = 0;
  uStack_460 = 0;
  local_4d8.server.cookie.additional_data.base = (uint8_t *)0x0;
  local_4d8.server.cookie.additional_data.len = 0;
  local_4d8.server.selected_psk_binder.len = 0;
  local_4d8.server.cookie.key = (void *)0x0;
  local_4d8.client.esni_keys.base = (uint8_t *)0x0;
  local_4d8.client.esni_keys.len = 0;
  local_4d8.client.max_early_data_size = (size_t *)0x0;
  local_4d8._40_8_ = 0;
  local_4d8.client.session_ticket.base = (uint8_t *)0x0;
  local_4d8.client.session_ticket.len = 0;
  local_4d8.client.negotiated_protocols.list = (ptls_iovec_t *)0x0;
  local_4d8.client.negotiated_protocols.count = 0;
  local_4d8._96_8_ = 1;
  local_598 = 0;
  uStack_590 = 0;
  local_578._40_8_ = 0;
  local_578.client.esni_keys.base = (uint8_t *)0x0;
  local_578.client.esni_keys.len = 0;
  local_578.server.selected_psk_binder.len = 0;
  local_578.server.cookie.key = (void *)0x0;
  local_578.server.cookie.additional_data.base = (uint8_t *)0x0;
  local_578.server.cookie.additional_data.len = 0;
  local_578._96_8_ = 0;
  uStack_510 = 0;
  local_508 = 0;
  uStack_500 = 0;
  local_588 = saved_ticket;
  local_578.client.negotiated_protocols.list = (ptls_iovec_t *)0x0;
  local_578.client.negotiated_protocols.count = 0;
  local_578.client.session_ticket = saved_ticket;
  local_578.client.max_early_data_size = &local_660;
  ppVar6 = ptls_client_new(ctx);
  ppVar6->data_ptr = local_238;
  ppVar5 = new_instance(ctx_peer,1);
  ppVar5->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
  (ppVar5->field_18).server.early_data_skipped_bytes = 0xffffffff;
  ppVar5->data_ptr = local_438;
  iVar4 = ptls_handle_message(ppVar6,&local_658,local_638,0,(void *)0x0,0,
                              (ptls_handshake_properties_t *)&local_578.client);
  _ok((uint)(iVar4 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x532)
  ;
  _ok((uint)(local_660 != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x533)
  ;
  iVar4 = bcmp(local_f8,"",0x40);
  _ok((uint)(iVar4 != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x534)
  ;
  iVar4 = feed_messages(ppVar5,&local_688,local_608,local_658.base,local_638,
                        (ptls_handshake_properties_t *)&local_4d8.client);
  _ok((uint)(iVar4 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x536)
  ;
  _ok((uint)(local_688.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x537)
  ;
  _ok((uint)(ppVar5->state < PTLS_STATE_CLIENT_POST_HANDSHAKE),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x538)
  ;
  iVar4 = feed_messages(ppVar6,&local_658,local_638,local_688.base,local_608,
                        (ptls_handshake_properties_t *)&local_578.client);
  _ok((uint)(iVar4 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x53a)
  ;
  _ok((uint)(local_658.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x53b)
  ;
  _ok((uint)(ppVar6->state < PTLS_STATE_CLIENT_POST_HANDSHAKE),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x53c)
  ;
  _ok((uint)(local_578.client.early_data_acceptance == PTLS_EARLY_DATA_REJECTED),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x53d)
  ;
  iVar4 = feed_messages(ppVar5,&local_688,local_608,local_658.base,local_638,
                        (ptls_handshake_properties_t *)&local_4d8.client);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x53f)
  ;
  _ok((uint)(ppVar5->state < PTLS_STATE_CLIENT_POST_HANDSHAKE),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x540)
  ;
  iVar4 = bcmp(local_3f8,"",0x40);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x541)
  ;
  _ok((uint)(local_688.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x542)
  ;
  iVar4 = feed_messages(ppVar6,&local_658,local_638,local_688.base,local_608,
                        (ptls_handshake_properties_t *)&local_578.client);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x544)
  ;
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar6->state),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x545)
  ;
  _ok((uint)(local_658.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x546)
  ;
  iVar4 = feed_messages(ppVar5,&local_688,local_608,local_658.base,local_638,
                        (ptls_handshake_properties_t *)&local_4d8.client);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x548)
  ;
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar5->state),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c");
  ptls_free(ppVar6);
  ptls_free(ppVar5);
  ppVar3 = ctx;
  local_658.off = 0;
  local_688.off = 0;
  ctx->update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  puVar1 = &ppVar3->field_0x70;
  *puVar1 = *puVar1 & 0xef;
  ppVar2 = ctx_peer;
  ctx_peer->update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  ppVar2->field_0x70 = ppVar2->field_0x70 & 0xef;
  local_4f8 = 0;
  uStack_4f0 = 0;
  local_578._40_8_ = 0;
  local_578.client.esni_keys.base = (uint8_t *)0x0;
  local_578.client.esni_keys.len = 0;
  local_578.server.selected_psk_binder.len = 0;
  local_578.server.cookie.key = (void *)0x0;
  local_578.server.cookie.additional_data.base = (uint8_t *)0x0;
  local_578.server.cookie.additional_data.len = 0;
  local_578._96_8_ = 0;
  uStack_510 = 0;
  local_508 = 0;
  uStack_500 = 0;
  local_4e8 = saved_ticket;
  local_578.client.negotiated_protocols.list = (ptls_iovec_t *)0x0;
  local_578.client.negotiated_protocols.count = 0;
  local_578.client.session_ticket = saved_ticket;
  local_578.client.max_early_data_size = &local_660;
  local_4d8.client.negotiated_protocols.list = (ptls_iovec_t *)0x0;
  local_4d8.client.negotiated_protocols.count = 0;
  local_4d8.client.session_ticket.base = (uint8_t *)0x0;
  local_4d8.client.session_ticket.len = 0;
  local_4d8.client.max_early_data_size = (size_t *)0x0;
  local_4d8._40_8_ = 0;
  local_4d8.client.esni_keys.base = (uint8_t *)0x0;
  local_4d8.client.esni_keys.len = 0;
  local_4d8.server.selected_psk_binder.len = 0;
  local_4d8.server.cookie.key = (void *)0x0;
  local_4d8.server.cookie.additional_data.base = (uint8_t *)0x0;
  local_4d8.server.cookie.additional_data.len = 0;
  uStack_470 = 0;
  local_468 = 0;
  uStack_460 = 0;
  local_4d8._96_8_ = 1;
  ppVar6 = ptls_client_new(ppVar3);
  ppVar5 = new_instance(ctx_peer,1);
  ppVar5->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
  (ppVar5->field_18).server.early_data_skipped_bytes = 0xffffffff;
  iVar4 = ptls_handshake(ppVar6,&local_658,(void *)0x0,(size_t *)0x0,
                         (ptls_handshake_properties_t *)&local_578.client);
  _ok((uint)(iVar4 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x55c)
  ;
  _ok((uint)(local_578.client.max_early_data_size != (size_t *)0x0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x55d)
  ;
  _ok((uint)(local_578.client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x55e)
  ;
  _ok((uint)(local_658.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x55f)
  ;
  iVar4 = ptls_send(ppVar6,&local_658,"hello world",0xb);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x561)
  ;
  local_5b8 = local_658.off;
  iVar4 = ptls_handshake(ppVar5,&local_688,local_658.base,&local_5b8,
                         (ptls_handshake_properties_t *)&local_4d8.client);
  _ok((uint)(iVar4 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x564)
  ;
  _ok((uint)(local_658.off == local_5b8),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x565)
  ;
  local_658.off = 0;
  _ok((uint)(local_688.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x567)
  ;
  local_5b8 = local_688.off;
  iVar4 = ptls_handshake(ppVar6,&local_658,local_688.base,&local_5b8,
                         (ptls_handshake_properties_t *)&local_578.client);
  _ok((uint)(iVar4 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x56a)
  ;
  _ok((uint)(local_578.client.early_data_acceptance == PTLS_EARLY_DATA_REJECTED),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x56b)
  ;
  _ok((uint)(local_688.off == local_5b8),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x56c)
  ;
  local_688.off = 0;
  _ok((uint)(local_658.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x56e)
  ;
  local_5b8 = local_658.off;
  iVar4 = ptls_handshake(ppVar5,&local_688,local_658.base,&local_5b8,
                         (ptls_handshake_properties_t *)&local_4d8.client);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x571)
  ;
  _ok((uint)(ppVar5->state < PTLS_STATE_CLIENT_POST_HANDSHAKE),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x572)
  ;
  _ok((uint)(local_658.off == local_5b8),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x573)
  ;
  local_658.off = 0;
  _ok((uint)(local_688.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x575)
  ;
  local_5b8 = local_688.off;
  iVar4 = ptls_handshake(ppVar6,&local_658,local_688.base,&local_5b8,
                         (ptls_handshake_properties_t *)&local_578.client);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x578)
  ;
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar6->state),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x579)
  ;
  _ok((uint)(local_5b8 < local_688.off),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x57a)
  ;
  local_688.off = 0;
  local_5b8 = local_658.off;
  iVar4 = ptls_handshake(ppVar5,&local_688,local_658.base,&local_5b8,
                         (ptls_handshake_properties_t *)&local_4d8.client);
  _ok((uint)(iVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x57e)
  ;
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar5->state),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x57f)
  ;
  _ok((uint)(local_688.off == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c");
  ptls_free(ppVar6);
  ptls_free(ppVar5);
  (*ptls_clear_memory)(local_658.base,local_658.off);
  if (local_658.is_allocated != 0) {
    free(local_658.base);
  }
  local_658.off = 0;
  local_658.is_allocated = 0;
  local_658._28_4_ = 0;
  local_658.base = (uint8_t *)0x0;
  local_658.capacity = 0;
  (*ptls_clear_memory)(local_688.base,local_688.off);
  if (local_688.is_allocated != 0) {
    free(local_688.base);
  }
  ppVar2 = ctx;
  ctx->update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  puVar1 = &ppVar2->field_0x70;
  *puVar1 = *puVar1 & 0xef;
  ppVar2->save_ticket = (ptls_save_ticket_t *)0x0;
  ppVar2 = ctx_peer;
  ctx_peer->update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  ppVar2->field_0x70 = ppVar2->field_0x70 & 0xef;
  ppVar2->ticket_lifetime = 0;
  ppVar2->max_early_data_size = 0;
  ppVar2->encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
  ppVar2->save_ticket = (ptls_save_ticket_t *)0x0;
  return;
}

Assistant:

static void test_handshake_api(void)
{
    ptls_t *client, *server;
    traffic_secrets_t client_secrets = {{{0}}}, server_secrets = {{{0}}};
    ptls_buffer_t cbuf, sbuf;
    size_t coffs[5] = {0}, soffs[5];
    ptls_update_traffic_key_t update_traffic_key = {on_update_traffic_key};
    ptls_encrypt_ticket_t encrypt_ticket = {on_copy_ticket};
    ptls_save_ticket_t save_ticket = {on_save_ticket};
    int ret;

    ctx->update_traffic_key = &update_traffic_key;
    ctx->omit_end_of_early_data = 1;
    ctx->save_ticket = &save_ticket;
    ctx_peer->update_traffic_key = &update_traffic_key;
    ctx_peer->omit_end_of_early_data = 1;
    ctx_peer->encrypt_ticket = &encrypt_ticket;
    ctx_peer->ticket_lifetime = 86400;
    ctx_peer->max_early_data_size = 8192;

    saved_ticket = ptls_iovec_init(NULL, 0);

    ptls_buffer_init(&cbuf, "", 0);
    ptls_buffer_init(&sbuf, "", 0);

    client = ptls_new(ctx, 0);
    *ptls_get_data_ptr(client) = &client_secrets;
    server = ptls_new(ctx_peer, 1);
    *ptls_get_data_ptr(server) = &server_secrets;

    /* full handshake */
    ret = ptls_handle_message(client, &cbuf, coffs, 0, NULL, 0, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off != 0);
    ok(!ptls_handshake_is_complete(server));
    ok(memcmp(server_secrets[1][2], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ok(memcmp(server_secrets[1][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ok(memcmp(server_secrets[0][2], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ok(memcmp(server_secrets[0][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) == 0);
    ret = feed_messages(client, &cbuf, coffs, sbuf.base, soffs, NULL);
    ok(ret == 0);
    ok(cbuf.off != 0);
    ok(ptls_handshake_is_complete(client));
    ok(memcmp(client_secrets[0][2], server_secrets[1][2], PTLS_MAX_DIGEST_SIZE) == 0);
    ok(memcmp(client_secrets[1][2], server_secrets[0][2], PTLS_MAX_DIGEST_SIZE) == 0);
    ok(memcmp(client_secrets[0][3], server_secrets[1][3], PTLS_MAX_DIGEST_SIZE) == 0);
    ok(memcmp(client_secrets[1][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off == 0);
    ok(ptls_handshake_is_complete(server));
    ok(memcmp(client_secrets[1][3], server_secrets[0][3], PTLS_MAX_DIGEST_SIZE) == 0);

    ptls_free(client);
    ptls_free(server);

    cbuf.off = 0;
    sbuf.off = 0;
    memset(client_secrets, 0, sizeof(client_secrets));
    memset(server_secrets, 0, sizeof(server_secrets));
    memset(coffs, 0, sizeof(coffs));
    memset(soffs, 0, sizeof(soffs));

    ctx->save_ticket = NULL; /* don't allow further test to update the saved ticket */

    /* 0-RTT resumption */
    size_t max_early_data_size = 0;
    ptls_handshake_properties_t client_hs_prop = {{{{NULL}, saved_ticket, &max_early_data_size}}};
    client = ptls_new(ctx, 0);
    *ptls_get_data_ptr(client) = &client_secrets;
    server = ptls_new(ctx_peer, 1);
    *ptls_get_data_ptr(server) = &server_secrets;
    ret = ptls_handle_message(client, &cbuf, coffs, 0, NULL, 0, &client_hs_prop);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(max_early_data_size != 0);
    ok(memcmp(client_secrets[1][1], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off != 0);
    ok(!ptls_handshake_is_complete(server));
    ok(memcmp(client_secrets[1][1], server_secrets[0][1], PTLS_MAX_DIGEST_SIZE) == 0);
    ok(memcmp(server_secrets[0][2], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0); /* !!!overlap!!! */
    ok(memcmp(server_secrets[1][2], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ok(memcmp(server_secrets[1][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ok(memcmp(server_secrets[0][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) == 0);
    ret = feed_messages(client, &cbuf, coffs, sbuf.base, soffs, &client_hs_prop);
    ok(ret == 0);
    ok(cbuf.off != 0);
    ok(ptls_handshake_is_complete(client));
    ok(memcmp(client_secrets[0][3], server_secrets[1][3], PTLS_MAX_DIGEST_SIZE) == 0);
    ok(memcmp(client_secrets[1][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off == 0);
    ok(ptls_handshake_is_complete(server));
    ok(memcmp(server_secrets[0][3], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);

    ptls_free(client);
    ptls_free(server);

    cbuf.off = 0;
    sbuf.off = 0;
    memset(client_secrets, 0, sizeof(client_secrets));
    memset(server_secrets, 0, sizeof(server_secrets));
    memset(coffs, 0, sizeof(coffs));
    memset(soffs, 0, sizeof(soffs));

    /* 0-RTT rejection */
    ctx_peer->max_early_data_size = 0;
    client_hs_prop = (ptls_handshake_properties_t){{{{NULL}, saved_ticket, &max_early_data_size}}};
    client = ptls_new(ctx, 0);
    *ptls_get_data_ptr(client) = &client_secrets;
    server = ptls_new(ctx_peer, 1);
    *ptls_get_data_ptr(server) = &server_secrets;
    ret = ptls_handle_message(client, &cbuf, coffs, 0, NULL, 0, &client_hs_prop);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(max_early_data_size != 0);
    ok(memcmp(client_secrets[1][1], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off != 0);
    ok(!ptls_handshake_is_complete(server));
    ret = feed_messages(client, &cbuf, coffs, sbuf.base, soffs, &client_hs_prop);
    ok(ret == 0);
    ok(cbuf.off != 0);
    ok(ptls_handshake_is_complete(client));
    ok(client_hs_prop.client.early_data_acceptance == PTLS_EARLY_DATA_REJECTED);
    ok(memcmp(server_secrets[0][1], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) == 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, NULL);
    ok(ret == 0);
    ok(sbuf.off == 0);
    ok(ptls_handshake_is_complete(server));

    ptls_free(client);
    ptls_free(server);

    cbuf.off = 0;
    sbuf.off = 0;
    memset(client_secrets, 0, sizeof(client_secrets));
    memset(server_secrets, 0, sizeof(server_secrets));
    memset(coffs, 0, sizeof(coffs));
    memset(soffs, 0, sizeof(soffs));

    /* HRR rejects 0-RTT */
    ctx_peer->max_early_data_size = 8192;
    ptls_handshake_properties_t server_hs_prop = {{{{NULL}}}};
    server_hs_prop.server.enforce_retry = 1;
    client_hs_prop = (ptls_handshake_properties_t){{{{NULL}, saved_ticket, &max_early_data_size}}};
    client = ptls_new(ctx, 0);
    *ptls_get_data_ptr(client) = &client_secrets;
    server = ptls_new(ctx_peer, 1);
    *ptls_get_data_ptr(server) = &server_secrets;
    ret = ptls_handle_message(client, &cbuf, coffs, 0, NULL, 0, &client_hs_prop); /* -> CH */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(max_early_data_size != 0);
    ok(memcmp(client_secrets[1][1], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, &server_hs_prop); /* CH -> HRR */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(sbuf.off != 0);
    ok(!ptls_handshake_is_complete(server));
    ret = feed_messages(client, &cbuf, coffs, sbuf.base, soffs, &client_hs_prop); /* HRR  -> CH */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(cbuf.off != 0);
    ok(!ptls_handshake_is_complete(client));
    ok(client_hs_prop.client.early_data_acceptance == PTLS_EARLY_DATA_REJECTED);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, &server_hs_prop); /* CH -> SH..SF */
    ok(ret == 0);
    ok(!ptls_handshake_is_complete(server));
    ok(memcmp(server_secrets[0][1], zeroes_of_max_digest_size, PTLS_MAX_DIGEST_SIZE) == 0);
    ok(sbuf.off != 0);
    ret = feed_messages(client, &cbuf, coffs, sbuf.base, soffs, &client_hs_prop); /* SH..SF -> CF */
    ok(ret == 0);
    ok(ptls_handshake_is_complete(client));
    ok(cbuf.off != 0);
    ret = feed_messages(server, &sbuf, soffs, cbuf.base, coffs, &server_hs_prop); /* CF -> */
    ok(ret == 0);
    ok(ptls_handshake_is_complete(server));

    ptls_free(client);
    ptls_free(server);

    cbuf.off = 0;
    sbuf.off = 0;

    /* shamelessly reuse this subtest for testing ordinary TLS 0-RTT with HRR rejection */
    ctx->update_traffic_key = NULL;
    ctx->omit_end_of_early_data = 0;
    ctx_peer->update_traffic_key = NULL;
    ctx_peer->omit_end_of_early_data = 0;
    client_hs_prop = (ptls_handshake_properties_t){{{{NULL}, saved_ticket, &max_early_data_size}}};
    server_hs_prop = (ptls_handshake_properties_t){{{{NULL}}}};
    server_hs_prop.server.enforce_retry = 1;
    client = ptls_new(ctx, 0);
    server = ptls_new(ctx_peer, 1);
    ret = ptls_handshake(client, &cbuf, NULL, NULL, &client_hs_prop); /* -> CH */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(client_hs_prop.client.max_early_data_size != 0);
    ok(client_hs_prop.client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN);
    ok(cbuf.off != 0);
    ret = ptls_send(client, &cbuf, "hello world", 11); /* send 0-RTT data that'll be rejected */
    ok(ret == 0);
    size_t inlen = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &inlen, &server_hs_prop); /* CH -> HRR */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(cbuf.off == inlen);
    cbuf.off = 0;
    ok(sbuf.off != 0);
    inlen = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &inlen, &client_hs_prop); /* HRR -> CH */
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(client_hs_prop.client.early_data_acceptance == PTLS_EARLY_DATA_REJECTED);
    ok(sbuf.off == inlen);
    sbuf.off = 0;
    ok(cbuf.off != 0);
    inlen = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &inlen, &server_hs_prop); /* CH -> SH..SF,NST */
    ok(ret == 0);
    ok(!ptls_handshake_is_complete(server));
    ok(cbuf.off == inlen);
    cbuf.off = 0;
    ok(sbuf.off != 0);
    inlen = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &inlen, &client_hs_prop); /* SH..SF -> CF */
    ok(ret == 0);
    ok(ptls_handshake_is_complete(client));
    ok(inlen < sbuf.off); /* ignore NST */
    sbuf.off = 0;
    inlen = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &inlen, &server_hs_prop); /* CF -> */
    ok(ret == 0);
    ok(ptls_handshake_is_complete(server));
    ok(sbuf.off == 0);

    ptls_free(client);
    ptls_free(server);

    ptls_buffer_dispose(&cbuf);
    ptls_buffer_dispose(&sbuf);

    ctx->update_traffic_key = NULL;
    ctx->omit_end_of_early_data = 0;
    ctx->save_ticket = NULL;
    ctx_peer->update_traffic_key = NULL;
    ctx_peer->omit_end_of_early_data = 0;
    ctx_peer->encrypt_ticket = NULL;
    ctx_peer->save_ticket = NULL;
    ctx_peer->ticket_lifetime = 0;
    ctx_peer->max_early_data_size = 0;
}